

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemRgEa<(moira::Instr)78,(moira::Mode)4,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  u32 uVar3;
  StrWriter *pSVar4;
  undefined1 local_38 [8];
  Ea<(moira::Mode)4,_4> dst;
  RegRegList src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext2._2_2_ = op;
  unique0x10000119 = addr;
  uVar3 = dasmIncRead<2>(this,addr);
  RegRegList::RegRegList((RegRegList *)&dst.ext2,(u16)uVar3);
  Op<(moira::Mode)4,4>
            ((Ea<(moira::Mode)4,_4> *)local_38,this,dst.ext2._2_2_ & 7,stack0xffffffffffffffe0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)(dst.ext2._0_2_ & 0xff) * 0x202020202 & 0x10884422010;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)((int)(uint)dst.ext2._0_2_ >> 8) * 0x202020202 & 0x10884422010;
  dst.ext2._0_2_ = CONCAT11(SUB161(auVar1 % ZEXT816(0x3ff),0),SUB161(auVar2 % ZEXT816(0x3ff),0));
  pSVar4 = StrWriter::operator<<(str);
  pSVar4 = StrWriter::operator<<(pSVar4);
  pSVar4 = StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
  pSVar4 = StrWriter::operator<<(pSVar4,dst.ext2._0_2_);
  pSVar4 = StrWriter::operator<<(pSVar4);
  StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)4,_4> *)local_38);
  return;
}

Assistant:

void
Moira::dasmMovemRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = RegRegList ( (u16)dasmIncRead<Word>(addr)  );
    auto dst = Op <M,S>   ( _____________xxx(op), addr );

    if constexpr (M == Mode(4)) { src.raw = REVERSE_16(src.raw); }
    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}